

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O3

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
NodeView::get_linked_tags_kmers
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,NodeView *this,string *datastore_name,int K,int min_tag_cov)

{
  long lVar1;
  LinkedReadsDatastore *pLVar2;
  long n;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tags;
  ReadSequenceBuffer ds_buffer;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  _Stack_c8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_98;
  ReadSequenceBuffer local_68;
  
  pLVar2 = WorkSpace::get_linked_reads_datastore(this->dg->sdg->ws,datastore_name);
  lVar1 = this->id;
  n = -lVar1;
  if (0 < lVar1) {
    n = lVar1;
  }
  LinkedReadsMapper::get_node_tags
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_98,
             &pLVar2->mapper,n);
  pLVar2 = WorkSpace::get_linked_reads_datastore(this->dg->sdg->ws,datastore_name);
  ReadSequenceBuffer::ReadSequenceBuffer(&local_68,pLVar2,0x1e00000,0x400000);
  pLVar2 = WorkSpace::get_linked_reads_datastore(this->dg->sdg->ws,datastore_name);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&_Stack_c8,&local_98);
  LinkedReadsDatastore::get_tags_kmers
            (__return_storage_ptr__,pLVar2,K,min_tag_cov,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&_Stack_c8
             ,&local_68);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&_Stack_c8);
  ReadSequenceBuffer::~ReadSequenceBuffer(&local_68);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<uint64_t> NodeView::get_linked_tags_kmers(std::string datastore_name, int K, int min_tag_cov){
    // Get tags
//    auto tags = get_linked_reads(datastore_name);
    std::set<LinkedTag> tags = dg->sdg.ws.get_linked_reads_datastore(datastore_name).mapper.get_node_tags(llabs(id));

    // Get kmers from tags
    ReadSequenceBuffer ds_buffer(dg->sdg.ws.get_linked_reads_datastore(datastore_name));
    return dg->sdg.ws.get_linked_reads_datastore(datastore_name).get_tags_kmers(K, min_tag_cov, tags, ds_buffer);
}